

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O2

uint64_t pow_mod_p(uint64_t a,uint64_t b)

{
  uint64_t uVar1;
  
  uVar1 = a;
  if (b != 1) {
    uVar1 = pow_mod_p(a,b >> 1);
    uVar1 = mul_mod_p(uVar1,uVar1);
    if ((b & 1) != 0) {
      uVar1 = mul_mod_p(uVar1,a);
      return uVar1;
    }
  }
  return uVar1;
}

Assistant:

static inline uint64_t
pow_mod_p(uint64_t a, uint64_t b) {
	if (b==1) {
		return a;
	}
	uint64_t t = pow_mod_p(a, b>>1);
	t = mul_mod_p(t,t);
	if (b % 2) {
		t = mul_mod_p(t, a);
	}
	return t;
}